

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_RSA_PARMS_Unmarshal(TPMS_RSA_PARMS *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_RSA_PARMS *target_local;
  
  target_local._4_4_ = TPMT_SYM_DEF_OBJECT_Unmarshal(&target->symmetric,buffer,size,1);
  if (((target_local._4_4_ == 0) &&
      (target_local._4_4_ = TPMT_RSA_SCHEME_Unmarshal(&target->scheme,buffer,size,1),
      target_local._4_4_ == 0)) &&
     (target_local._4_4_ = TPMI_RSA_KEY_BITS_Unmarshal(&target->keyBits,buffer,size),
     target_local._4_4_ == 0)) {
    target_local._4_4_ = UINT32_Unmarshal(&target->exponent,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_RSA_PARMS_Unmarshal(TPMS_RSA_PARMS *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMT_SYM_DEF_OBJECT_Unmarshal((TPMT_SYM_DEF_OBJECT *)&(target->symmetric), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_RSA_SCHEME_Unmarshal((TPMT_RSA_SCHEME *)&(target->scheme), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_RSA_KEY_BITS_Unmarshal((TPMI_RSA_KEY_BITS *)&(target->keyBits), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->exponent), buffer, size);
    return result;
}